

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerUtil.cpp
# Opt level: O1

ByteString * DERUTIL::raw2Octet(ByteString *__return_storage_ptr__,ByteString *byteString)

{
  size_t sVar1;
  uchar *puVar2;
  byte *pbVar3;
  long lVar4;
  long lVar5;
  size_t pos;
  ByteString header;
  ByteString local_50;
  
  ByteString::ByteString(&local_50);
  sVar1 = ByteString::size(byteString);
  if (sVar1 < 0x80) {
    ByteString::resize(&local_50,2);
    puVar2 = ByteString::operator[](&local_50,0);
    *puVar2 = '\x04';
    puVar2 = ByteString::operator[](&local_50,1);
    *puVar2 = (uchar)sVar1;
  }
  else {
    lVar5 = 8;
    lVar4 = 0x38;
    do {
      if ((char)(sVar1 >> ((byte)lVar4 & 0x3f)) != '\0') goto LAB_0012e2d2;
      lVar5 = lVar5 + -1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != -8);
    lVar5 = 0;
LAB_0012e2d2:
    ByteString::resize(&local_50,lVar5 + 2);
    puVar2 = ByteString::operator[](&local_50,0);
    *puVar2 = '\x04';
    pbVar3 = ByteString::operator[](&local_50,1);
    *pbVar3 = (byte)lVar5 | 0x80;
    if (lVar5 != 0) {
      pos = lVar5 + 1;
      do {
        puVar2 = ByteString::operator[](&local_50,pos);
        *puVar2 = (uchar)sVar1;
        sVar1 = sVar1 >> 8;
        pos = pos - 1;
      } while (pos != 1);
    }
  }
  operator+(__return_storage_ptr__,&local_50,byteString);
  local_50._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_50.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString DERUTIL::raw2Octet(const ByteString& byteString)
{
	ByteString header;
	size_t len = byteString.size();

	// Definite, short
	if (len < 0x80)
 	{
		header.resize(2);
		header[0] = (unsigned char)0x04;
		header[1] = (unsigned char)(len & 0x7F);
	}
	// Definite, long
	else
	{
		// Count significate bytes
		size_t bytes = sizeof(size_t);
		for(; bytes > 0; bytes--)
		{
			size_t value = len >> ((bytes - 1) * 8);
			if (value & 0xFF) break;
		}

		// Set header data
		header.resize(2 + bytes);
		header[0] = (unsigned char)0x04;
		header[1] = (unsigned char)(0x80 | bytes);
		for (size_t i = 1; i <= bytes; i++)
		{
			header[2+bytes-i] = (unsigned char) (len & 0xFF);
			len >>= 8;
		}
	}

	return header + byteString;
}